

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void line_attempt_4(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t y;
  size_t x;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  TGAColor local_60 [2];
  float local_54;
  TGAImage *local_50;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_60[0].bgra = color.bgra;
  uVar3 = x0 - x1;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  local_60[0].bytespp = color.bytespp;
  uVar4 = y0 - y1;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  iVar11 = x1;
  iVar8 = y0;
  if (uVar2 < uVar3) {
    iVar11 = y1;
    iVar8 = x0;
    y1 = x1;
    x0 = y0;
  }
  iVar6 = y1;
  iVar5 = x0;
  iVar10 = iVar11;
  if (iVar11 < x0) {
    iVar6 = iVar8;
    iVar5 = iVar11;
    iVar8 = y1;
    iVar10 = x0;
  }
  if (iVar5 <= iVar10) {
    iVar7 = iVar6 - iVar8;
    local_48 = ABS((float)iVar7 / (float)(iVar10 - iVar5));
    uStack_44 = in_XMM1_Db & 0x7fffffff;
    uStack_40 = in_XMM1_Dc & 0x7fffffff;
    uStack_3c = in_XMM1_Dd & 0x7fffffff;
    bVar1 = iVar8 <= iVar6;
    if (iVar11 < x0) {
      x0 = iVar11;
    }
    sVar9 = (size_t)x0;
    iVar11 = (iVar10 - x0) + 1;
    local_54 = 0.0;
    local_50 = image;
    do {
      y = (long)iVar8;
      x = sVar9;
      if (uVar2 < uVar3) {
        y = sVar9;
        x = (long)iVar8;
      }
      TGAImage::set(local_50,x,y,local_60);
      fVar12 = local_54 + local_48;
      local_54 = fVar12 + -1.0;
      if (fVar12 <= 0.5) {
        local_54 = fVar12;
      }
      iVar6 = 0;
      if (0.5 < fVar12) {
        iVar6 = (uint)(iVar7 != 0 && bVar1) * 2 + -1;
      }
      iVar8 = iVar8 + iVar6;
      sVar9 = sVar9 + 1;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  return;
}

Assistant:

void line_attempt_4(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    int dx = x1 - x0;
    int dy = y1 - y0;
    float derror = std::abs(static_cast<float>(dy) / static_cast<float>(dx));
    float error = 0;
    int y = y0;
    for (int x = x0; x <= x1; x++) {
        if (steep) {
            image.set(y, x, color);
        } else {
            image.set(x, y, color);
        }
        error += derror;
        if (error > .5f) {
            y += (y1 > y0 ? 1 : -1);
            error -= 1.f;
        }
    }
}